

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCodeFactorable(Parse *pParse,Expr *pExpr,int target)

{
  Walker local_50;
  
  if (pParse->okConstFactor == '\0') {
LAB_00184fb6:
    sqlite3ExprCode(pParse,pExpr,target);
  }
  else {
    local_50.eCode = '\x02';
    local_50.xExprCallback = exprNodeIsConstant;
    local_50.xSelectCallback = sqlite3SelectWalkFail;
    local_50.u.n = 0;
    if (pExpr != (Expr *)0x0) {
      walkExpr(&local_50,pExpr);
      if (local_50.eCode == '\0') goto LAB_00184fb6;
    }
    sqlite3ExprCodeAtInit(pParse,pExpr,target);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeFactorable(Parse *pParse, Expr *pExpr, int target){
  if( pParse->okConstFactor && sqlite3ExprIsConstantNotJoin(pExpr) ){
    sqlite3ExprCodeAtInit(pParse, pExpr, target);
  }else{
    sqlite3ExprCode(pParse, pExpr, target);
  }
}